

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translator.cpp
# Opt level: O2

ExprNode * __thiscall Translator::visit(Translator *this,PrimaryNode *primaryNode)

{
  ExpNode *pEVar1;
  int iVar2;
  VarSymbol *pVVar3;
  undefined4 extraout_var;
  ExprNode *pEVar4;
  undefined4 extraout_var_00;
  Label *pLVar5;
  MEM *this_00;
  NAME *pNVar6;
  Literal *this_01;
  TokenNode *pTVar7;
  double dVar8;
  char name [200];
  
  pTVar7 = primaryNode->token;
  if ((pTVar7 == (TokenNode *)0x0) || (pTVar7->token != 10)) {
    pEVar1 = primaryNode->exp;
    if (pEVar1 != (ExpNode *)0x0) {
      iVar2 = (*(pEVar1->super_StmtNode).super_ASTNode._vptr_ASTNode[4])(pEVar1,this);
      return (ExprNode *)CONCAT44(extraout_var_00,iVar2);
    }
    iVar2 = pTVar7->token;
    if (iVar2 != 0x1e) {
      if (iVar2 == 0x1f) {
        pEVar4 = (ExprNode *)operator_new(0x10);
        CONST::CONST((CONST *)pEVar4,1);
        return pEVar4;
      }
      if (iVar2 == 0x20) {
        pEVar4 = (ExprNode *)operator_new(0x10);
        CONST::CONST((CONST *)pEVar4,0);
        return pEVar4;
      }
      if (iVar2 != 0x38) {
        if (iVar2 == 0x37) {
          pEVar4 = (ExprNode *)operator_new(0x10);
          dVar8 = atof((pTVar7->super_ExpNode).lexeme);
          CONSTF::CONSTF((CONSTF *)pEVar4,(float)dVar8);
          return pEVar4;
        }
        if (iVar2 == 0x36) {
          pEVar4 = (ExprNode *)operator_new(0x10);
          iVar2 = atoi((pTVar7->super_ExpNode).lexeme);
          CONST::CONST((CONST *)pEVar4,iVar2);
          return pEVar4;
        }
        goto LAB_00113b94;
      }
    }
    this_01 = (Literal *)operator_new(0x18);
    Literal::Literal(this_01,(pTVar7->super_ExpNode).lexeme);
    (this_01->super_Fragment).next = this->fragmentList;
    this->fragmentList = (Fragment *)this_01;
    pNVar6 = (NAME *)operator_new(0x18);
    pLVar5 = (Label *)operator_new(0x10);
    Label::Label(pLVar5,(primaryNode->token->super_ExpNode).lexeme);
    NAME::NAME(pNVar6,pLVar5);
  }
  else {
    if (this->activeFunction != (FunctionSymbol *)0x0) {
      pVVar3 = VarTable::searchInScope
                         (this->varTable,(pTVar7->super_ExpNode).lexeme,
                          (this->activeFunction->super_Symbol).lexeme);
      pTVar7 = primaryNode->token;
      if (pVVar3 != (VarSymbol *)0x0) {
        iVar2 = (*(this->currentFrame->super_Frame)._vptr_Frame[1])
                          (this->currentFrame,0,(ulong)(uint)pTVar7->size);
        pEVar4 = (ExprNode *)
                 (*(code *)**(undefined8 **)CONCAT44(extraout_var,iVar2))
                           ((undefined8 *)CONCAT44(extraout_var,iVar2));
        return pEVar4;
      }
    }
    pVVar3 = VarTable::cSearch(this->varTable,(pTVar7->super_ExpNode).lexeme);
    if (pVVar3 != (VarSymbol *)0x0) {
      sprintf(name,"nonLocal_var_%s",(primaryNode->token->super_ExpNode).lexeme);
      pLVar5 = (Label *)operator_new(0x10);
      Label::Label(pLVar5,name);
      this_00 = (MEM *)operator_new(0x18);
      pNVar6 = (NAME *)operator_new(0x18);
      NAME::NAME(pNVar6,pLVar5);
      MEM::MEM(this_00,(ExprNode *)pNVar6);
      return &this_00->super_ExprNode;
    }
LAB_00113b94:
    pNVar6 = (NAME *)0x0;
  }
  return &pNVar6->super_ExprNode;
}

Assistant:

ExprNode *Translator::visit(PrimaryNode *primaryNode) {//TODO checar casos de arranjos?
    //checa se eh ID
    if (primaryNode->getTokenNode() && primaryNode->getTokenNode()->getToken() == ID) {
        VarSymbol *aux;
        if (activeFunction) {
            aux = varTable->searchInScope(primaryNode->getTokenNode()->getLexeme(), activeFunction->getLexeme());
        }
        if (aux)// variavel local
        {
            //TODO verificar corretude
            LocalAccess *tmp = this->currentFrame->addLocal(false, primaryNode->getTokenNode()->getSize());
            return tmp->accessCode();
//            return new BINOP(PLUS, new TEMP(FP), new CONST(aux->getOffset()));
        } else {
            aux = varTable->cSearch(primaryNode->getTokenNode()->getLexeme());
            if (aux) {// var nonLocal
                char name[200];
                sprintf(name, "nonLocal_var_%s", primaryNode->getTokenNode()->getLexeme());
                Label *labelAUX = new Label(name);
                return new MEM(new NAME(labelAUX));
            }
        }
    } else // nao eh ID
    {
        //checa se eh expressao
        if (primaryNode->getExp()) {
            return primaryNode->getExp()->accept(this);
        }
        //checa se eh um primitivo
        if (primaryNode->getTokenNode()->getToken() == NUMINT) {
            return new CONST(atoi(primaryNode->getTokenNode()->getLexeme()));
        }

        if (primaryNode->getTokenNode()->getToken() == NUMFLOAT) {
            return new CONSTF(atof(primaryNode->getTokenNode()->getLexeme()));
        }

        if (primaryNode->getTokenNode()->getToken() == LITERALCHAR ||
            primaryNode->getTokenNode()->getToken() == LITERAL) {
            Literal *literal = new Literal(primaryNode->getTokenNode()->getLexeme());
            //TODO verificar
            literal->setNext(fragmentList);
            fragmentList = literal;
            return new NAME(new Label(primaryNode->getTokenNode()->getLexeme()));
        }

        if (primaryNode->getTokenNode()->getToken() == TRUE) {
            return new CONST(1);
        }

        if (primaryNode->getTokenNode()->getToken() == FALSE) {
            return new CONST(0);
        }
    }

    return NULL;
}